

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteAddressPreviouslySpent
          (WalletBatch *this,CTxDestination *dest,bool previously_spent)

{
  byte bVar1;
  bool bVar2;
  byte in_DL;
  char *in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  WalletBatch *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  WalletBatch *this_00;
  undefined7 in_stack_fffffffffffffed8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  this_01 = in_RDI;
  EncodeDestination_abi_cxx11_
            ((CTxDestination *)
             CONCAT17(in_stack_fffffffffffffeaf,
                      CONCAT16(in_stack_fffffffffffffeae,
                               CONCAT15(in_stack_fffffffffffffead,
                                        CONCAT14(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                )))));
  this_00 = (WalletBatch *)((long)&local_10a[0]._M_dataplus._M_p + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this_01->first,in_RSI,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffed8));
  std::make_pair<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first);
  std::make_pair<std::__cxx11::string_const&,std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_stack_fffffffffffffea0,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe98->first);
  std::allocator<char>::~allocator((allocator<char> *)((long)&local_10a[0]._M_dataplus._M_p + 1));
  std::__cxx11::string::~string(&in_stack_fffffffffffffe98->first);
  if ((bVar1 & 1) == 0) {
    bVar2 = EraseIC<std::pair<std::__cxx11::string,std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      (in_stack_fffffffffffffeb0,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffeaf,
                                   CONCAT16(in_stack_fffffffffffffeae,
                                            CONCAT15(in_stack_fffffffffffffead,
                                                     CONCAT14(in_stack_fffffffffffffeac,
                                                              in_stack_fffffffffffffea8)))));
  }
  else {
    value = local_10a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&this_01->first,in_RSI,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffed8));
    bVar2 = WriteIC<std::pair<std::__cxx11::string,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::__cxx11::string>
                      (this_00,in_RDI,value,(bool)in_stack_fffffffffffffeaf);
    std::__cxx11::string::~string(&in_stack_fffffffffffffe98->first);
    std::allocator<char>::~allocator((allocator<char> *)local_10a);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~pair(in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool WalletBatch::WriteAddressPreviouslySpent(const CTxDestination& dest, bool previously_spent)
{
    auto key{std::make_pair(DBKeys::DESTDATA, std::make_pair(EncodeDestination(dest), std::string("used")))};
    return previously_spent ? WriteIC(key, std::string("1")) : EraseIC(key);
}